

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::LoadArena(Map *this)

{
  World *pWVar1;
  Character *this_00;
  Map *pMVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  Arena *pAVar7;
  int in_EDX;
  int extraout_EDX;
  int subject;
  int subject_00;
  int subject_01;
  list<Character_*,_std::allocator<Character_*>_> *plVar8;
  string *psVar9;
  _List_node_base *p_Var10;
  Arena_Spawn *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> spawn;
  Character *character;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  spawns;
  list<Character_*,_std::allocator<Character_*>_> update_characters;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  update_characters.super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&update_characters;
  update_characters.super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
  _M_size = 0;
  update_characters.super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       update_characters.super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node
       .super__List_node_base._M_next;
  if (this->arena != (Arena *)0x0) {
    plVar8 = &this->arena->map->characters;
    p_Var10 = (_List_node_base *)plVar8;
    while (p_Var10 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var10->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)plVar8) {
      character = (Character *)p_Var10[1]._M_next;
      if (character->arena == this->arena) {
        std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::push_back
                  (&update_characters,&character);
      }
    }
    pAVar7 = this->arena;
    if (pAVar7 != (Arena *)0x0) {
      Arena::~Arena(pAVar7);
    }
    operator_delete(pAVar7,0x38);
    in_EDX = extraout_EDX;
  }
  pWVar1 = this->world;
  util::to_string_abi_cxx11_(&spawn,(util *)(ulong)(uint)(int)this->id,in_EDX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
                 &spawn,".enabled");
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->arenas_config,(key_type *)&character);
  bVar3 = util::variant::GetBool(pmVar6);
  std::__cxx11::string::~string((string *)&character);
  std::__cxx11::string::~string((string *)&spawn);
  if (bVar3) {
    pWVar1 = this->world;
    util::to_string_abi_cxx11_((string *)&s,(util *)(ulong)(uint)(int)this->id,subject);
    std::operator+(&spawn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   ".spawns");
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->arenas_config,&spawn);
    util::variant::GetString_abi_cxx11_((string *)&character,pmVar6);
    std::__cxx11::string::~string((string *)&spawn);
    std::__cxx11::string::~string((string *)&s);
    util::explode(&spawns,',',(string *)&character);
    if (((int)spawns.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)spawns.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x60U) == 0) {
      pAVar7 = (Arena *)operator_new(0x38);
      pWVar1 = this->world;
      util::to_string_abi_cxx11_((string *)&s,(util *)(ulong)(uint)(int)this->id,subject_00);
      std::operator+(&spawn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                     ".time");
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->arenas_config,&spawn);
      iVar4 = util::variant::GetInt(pmVar6);
      pWVar1 = this->world;
      util::to_string_abi_cxx11_(&local_90,(util *)(ulong)(uint)(int)this->id,subject_01);
      std::operator+(&local_70,&local_90,".block");
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->arenas_config,&local_70);
      iVar5 = util::variant::GetInt(pmVar6);
      Arena::Arena(pAVar7,this,iVar4,iVar5);
      this->arena = pAVar7;
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&spawn);
      std::__cxx11::string::~string((string *)&s);
      this->arena->occupants =
           (int)update_characters.super__List_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl._M_node._M_size;
      s = (Arena_Spawn *)0x0;
      iVar4 = 1;
      for (psVar9 = (string *)
                    CONCAT44(spawns.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)spawns.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          psVar9 != (string *)
                    CONCAT44(spawns.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (int)spawns.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
          psVar9 = psVar9 + 0x20) {
        std::__cxx11::string::string((string *)&spawn,psVar9);
        util::trim(&local_50,&spawn);
        std::__cxx11::string::~string((string *)&local_50);
        switch((long)iVar4 % 4 & 0xffffffff) {
        case 0:
          iVar5 = util::to_int(&spawn);
          s->dy = (uchar)iVar5;
          std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>::push_back
                    (&this->arena->spawns,&s);
          s = (Arena_Spawn *)0x0;
          break;
        case 1:
          s = (Arena_Spawn *)operator_new(4);
          iVar5 = util::to_int(&spawn);
          s->sx = (uchar)iVar5;
          break;
        case 2:
          iVar5 = util::to_int(&spawn);
          s->sy = (uchar)iVar5;
          break;
        case 3:
          iVar5 = util::to_int(&spawn);
          s->dx = (uchar)iVar5;
        }
        std::__cxx11::string::~string((string *)&spawn);
        iVar4 = iVar4 + 1;
      }
      if (s != (Arena_Spawn *)0x0) {
        Console::Wrn("Invalid arena spawn string");
        operator_delete(s,4);
      }
    }
    else {
      Console::Wrn("Invalid arena spawn data for map %i",(ulong)(uint)(int)this->id);
      this->arena = (Arena *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&spawns);
    std::__cxx11::string::~string((string *)&character);
  }
  else {
    this->arena = (Arena *)0x0;
  }
  p_Var10 = (_List_node_base *)&update_characters;
  while (p_Var10 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var10->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var10 != (_List_node_base *)&update_characters) {
    this_00 = (Character *)p_Var10[1]._M_next;
    pAVar7 = this->arena;
    this_00->arena = pAVar7;
    if (pAVar7 == (Arena *)0x0) {
      pMVar2 = this_00->map;
      Character::Warp(this_00,pMVar2->id,pMVar2->relog_x,pMVar2->relog_y,WARP_ANIMATION_NONE);
    }
  }
  std::__cxx11::_List_base<Character_*,_std::allocator<Character_*>_>::_M_clear
            (&update_characters.super__List_base<Character_*,_std::allocator<Character_*>_>);
  return;
}

Assistant:

void Map::LoadArena()
{
	std::list<Character *> update_characters;

	if (this->arena)
	{
		UTIL_FOREACH(this->arena->map->characters, character)
		{
			if (character->arena == this->arena)
			{
				update_characters.push_back(character);
			}
		}

		delete this->arena;
	}

	if (world->arenas_config[util::to_string(id) + ".enabled"])
	{
		std::string spawns_str = world->arenas_config[util::to_string(id) + ".spawns"];

		std::vector<std::string> spawns = util::explode(',', spawns_str);

		if (spawns.size() % 4 != 0)
		{
			Console::Wrn("Invalid arena spawn data for map %i", id);
			this->arena = 0;
		}
		else
		{
			this->arena = new Arena(this, static_cast<int>(world->arenas_config[util::to_string(id) + ".time"]), static_cast<int>(world->arenas_config[util::to_string(id) + ".block"]));
			this->arena->occupants = update_characters.size();

			int i = 1;
			Arena_Spawn *s = 0;
			UTIL_FOREACH(spawns, spawn)
			{
				util::trim(spawn);

				switch (i++ % 4)
				{
					case 1:
						s = new Arena_Spawn;
						s->sx = util::to_int(spawn);
						break;

					case 2:
						s->sy = util::to_int(spawn);
						break;

					case 3:
						s->dx = util::to_int(spawn);
						break;

					case 0:
						s->dy = util::to_int(spawn);
						this->arena->spawns.push_back(s);
						s = 0;
						break;
				}
			}

			if (s)
			{
				Console::Wrn("Invalid arena spawn string");
				delete s;
			}
		}
	}
	else
	{
		this->arena = 0;
	}

	UTIL_FOREACH(update_characters, character)
	{
		character->arena = this->arena;

		if (!this->arena)
		{
			character->Warp(character->map->id, character->map->relog_x, character->map->relog_y);
		}
	}
}